

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  uint uVar1;
  REF_INT node;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  REF_STATUS RVar8;
  REF_DBL *pRVar9;
  ulong uVar10;
  int *piVar11;
  REF_INT *pRVar12;
  REF_ADJ_ITEM pRVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  REF_CELL pRVar17;
  REF_DICT ref_dict_00;
  REF_GEOM pRVar18;
  long lVar19;
  char *pcVar20;
  int iVar21;
  REF_INT RVar22;
  REF_NODE pRVar23;
  FILE *__stream;
  long lVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  int iVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  REF_INT local;
  REF_DBL ks;
  REF_DBL kr;
  REF_DBL gap;
  REF_DICT ref_dict_degen;
  REF_DICT ref_dict_jump;
  REF_DICT ref_dict;
  REF_INT sens;
  REF_DBL xyz [3];
  REF_DBL param [2];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_INT nodes [27];
  int local_19c;
  uint local_198;
  REF_INT local_194;
  REF_CELL local_190;
  REF_DBL local_188;
  REF_DBL local_180;
  REF_DBL local_178;
  REF_DICT local_170;
  REF_DICT local_168;
  REF_DICT local_160;
  FILE *local_158;
  REF_GEOM local_150;
  REF_GRID local_148;
  int local_140;
  uint local_13c;
  REF_DBL local_138;
  REF_DBL local_130;
  REF_DBL local_128;
  REF_DBL *local_118;
  REF_DBL *local_110;
  REF_NODE local_108;
  long local_100;
  REF_DBL local_f8;
  REF_DBL RStack_f0;
  REF_DBL local_e8 [4];
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  pRVar23 = ref_grid->node;
  pRVar17 = ref_grid->cell[3];
  pRVar18 = ref_grid->geom;
  uVar7 = ref_dict_create(&local_160);
  if (uVar7 == 0) {
    local_148 = ref_grid;
    local_108 = pRVar23;
    uVar7 = ref_dict_create(&local_168);
    if (uVar7 == 0) {
      uVar7 = ref_dict_create(&local_170);
      if (uVar7 == 0) {
        local_190 = pRVar17;
        local_158 = (FILE *)file;
        local_150 = pRVar18;
        if (pRVar18->max < 1) {
          lVar15 = 0;
        }
        else {
          lVar15 = 0;
          do {
            pRVar12 = pRVar18->descr;
            if ((pRVar12[lVar15 * 6] == 2) && (pRVar12[lVar15 * 6 + 1] == id)) {
              uVar1 = pRVar12[lVar15 * 6 + 5];
              if (pRVar12[lVar15 * 6 + 4] == 0) {
                uVar7 = ref_dict_store(local_160,uVar1,(REF_INT)lVar15);
                if (uVar7 != 0) {
                  pcVar20 = "mark nodes";
                  uVar14 = 0xcb1;
                  goto LAB_00196c7b;
                }
                if ((pRVar18->descr[lVar15 * 6 + 3] != 0) &&
                   (uVar7 = ref_dict_store(local_168,uVar1,(REF_INT)lVar15), uVar7 != 0)) {
                  pcVar20 = "mark jump";
                  uVar14 = 0xcb3;
                  goto LAB_00196c7b;
                }
              }
              else if (((-1 < (int)uVar1) &&
                       (pRVar2 = local_190->ref_adj, (int)uVar1 < pRVar2->nnode)) &&
                      (iVar21 = pRVar2->first[uVar1], iVar21 != -1)) {
                pRVar13 = pRVar2->item;
                do {
                  RVar22 = pRVar13[iVar21].ref;
                  uVar7 = ref_cell_nodes(local_190,RVar22,local_a8);
                  if (uVar7 != 0) {
                    pcVar20 = "nodes";
                    uVar14 = 0xcb7;
                    goto LAB_00196c7b;
                  }
                  if ((local_a8[3] == id) &&
                     (uVar7 = ref_dict_store(local_170,RVar22,uVar1), uVar7 != 0)) {
                    pcVar20 = "mark degen";
                    uVar14 = 0xcb9;
                    goto LAB_00196c7b;
                  }
                  pRVar13 = local_190->ref_adj->item;
                  iVar21 = pRVar13[iVar21].next;
                  pRVar18 = local_150;
                } while (iVar21 != -1);
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < pRVar18->max);
        }
        pRVar17 = local_190;
        local_194 = (REF_INT)lVar15;
        if (0 < local_190->max) {
          local_100 = (long)local_160->n;
          iVar21 = local_168->n + local_160->n;
          local_198 = local_170->n + iVar21;
          RVar22 = 0;
          uVar7 = 0;
          do {
            RVar8 = ref_cell_nodes(pRVar17,RVar22,local_a8);
            uVar1 = local_198;
            uVar7 = uVar7 + (local_a8[3] == id && RVar8 == 0);
            RVar22 = RVar22 + 1;
          } while (RVar22 < pRVar17->max);
          if ((local_198 != 0) && (uVar7 != 0)) {
            fprintf(local_158,
                    "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                    (ulong)(uint)id,(ulong)local_198,(ulong)uVar7,"point","fetriangle");
            if ((int)uVar1 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xcd9,"ref_geom_face_tec_zone","malloc uv of REF_DBL negative");
              return 1;
            }
            uVar1 = uVar1 * 2;
            pRVar9 = (REF_DBL *)malloc((ulong)uVar1 << 3);
            pRVar18 = local_150;
            auVar31 = _DAT_00218960;
            if (pRVar9 == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xcd9,"ref_geom_face_tec_zone","malloc uv of REF_DBL NULL");
              return 2;
            }
            uVar10 = 1;
            if (1 < (int)uVar1) {
              uVar10 = (ulong)uVar1;
            }
            lVar15 = uVar10 - 1;
            auVar25._8_4_ = (int)lVar15;
            auVar25._0_8_ = lVar15;
            auVar25._12_4_ = (int)((ulong)lVar15 >> 0x20);
            lVar15 = 0;
            auVar25 = auVar25 ^ _DAT_00218960;
            auVar27 = _DAT_00218950;
            do {
              bVar4 = auVar25._0_4_ < SUB164(auVar27 ^ auVar31,0);
              iVar26 = auVar25._4_4_;
              iVar33 = SUB164(auVar27 ^ auVar31,4);
              if ((bool)(~(iVar26 < iVar33 || iVar33 == iVar26 && bVar4) & 1)) {
                *(undefined8 *)((long)pRVar9 + lVar15) = 0xbff0000000000000;
              }
              if (iVar26 >= iVar33 && (iVar33 != iVar26 || !bVar4)) {
                *(undefined8 *)((long)pRVar9 + lVar15 + 8) = 0xbff0000000000000;
              }
              lVar19 = auVar27._8_8_;
              auVar27._0_8_ = auVar27._0_8_ + 2;
              auVar27._8_8_ = lVar19 + 2;
              lVar15 = lVar15 + 0x10;
            } while ((ulong)((int)uVar10 + 1U & 0xfffffffe) << 3 != lVar15);
            local_198 = id;
            local_140 = iVar21;
            if (0 < pRVar17->max) {
              RVar22 = 0;
              do {
                RVar8 = ref_cell_nodes(pRVar17,RVar22,local_a8);
                if (((RVar8 == 0) && (local_a8[3] == local_198)) && (0 < pRVar17->node_per)) {
                  lVar15 = 0;
                  do {
                    node = local_a8[lVar15];
                    uVar7 = ref_geom_find(pRVar18,node,2,local_198,&local_194);
                    if (uVar7 != 0) {
                      pcVar20 = "find";
                      uVar14 = 0xcde;
                      goto LAB_00196c7b;
                    }
                    uVar7 = ref_geom_cell_tuv(pRVar18,node,local_a8,2,&local_f8,
                                              (REF_INT *)&local_13c);
                    pRVar17 = local_190;
                    if (uVar7 != 0) {
                      pcVar20 = "cell tuv";
                      uVar14 = 0xce1;
                      goto LAB_00196c7b;
                    }
                    if (pRVar18->descr[(long)local_194 * 6 + 4] == 0) {
                      if (local_13c < 2) {
                        uVar7 = ref_dict_location(local_160,local_a8[lVar15],&local_19c);
                        if (uVar7 != 0) {
                          pcVar20 = "localize";
                          uVar14 = 0xce4;
                          goto LAB_00196c7b;
                        }
                      }
                      else {
                        uVar7 = ref_dict_location(local_168,local_a8[lVar15],&local_19c);
                        if (uVar7 != 0) {
                          pcVar20 = "localize";
                          uVar14 = 0xce7;
                          goto LAB_00196c7b;
                        }
                        local_19c = local_19c + (int)local_100;
                      }
                    }
                    else {
                      uVar7 = ref_dict_location(local_170,RVar22,&local_19c);
                      if (uVar7 != 0) {
                        pcVar20 = "localize";
                        uVar14 = 0xceb;
                        goto LAB_00196c7b;
                      }
                      local_19c = local_19c + local_140;
                      pRVar17 = local_190;
                    }
                    pRVar9[local_19c * 2] = local_f8;
                    (pRVar9 + local_19c * 2)[1] = RStack_f0;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 < pRVar17->node_per);
                }
                RVar22 = RVar22 + 1;
              } while (RVar22 < pRVar17->max);
            }
            __stream = local_158;
            local_118 = pRVar9;
            if (0 < local_160->n) {
              piVar11 = local_160->key;
              pRVar12 = local_160->value;
              local_110 = (REF_DBL *)0x1;
              lVar15 = 4;
              while( true ) {
                pRVar18 = local_150;
                RVar22 = *pRVar12;
                iVar21 = *piVar11;
                lVar19 = (long)iVar21;
                local_180 = 0.0;
                local_188 = 0.0;
                local_178 = 0.0;
                pRVar3 = local_108->real;
                local_138 = pRVar3[lVar19 * 0xf];
                local_130 = pRVar3[lVar19 * 0xf + 1];
                local_128 = pRVar3[lVar19 * 0xf + 2];
                if (local_150->model != (void *)0x0) {
                  uVar7 = ref_egads_face_curvature
                                    (local_150,RVar22,&local_180,local_c8,&local_188,local_e8);
                  if (1 < uVar7) {
                    pcVar20 = "curve";
                    uVar14 = 0xcfd;
                    goto LAB_00196c7b;
                  }
                  uVar7 = ref_egads_eval_at(pRVar18,2,local_198,pRVar9,&local_138,(REF_DBL *)0x0);
                  if (uVar7 != 0) {
                    pcVar20 = "eval at";
                    uVar14 = 0xd00;
                    goto LAB_00196c7b;
                  }
                  uVar7 = ref_egads_gap(pRVar18,iVar21,&local_178);
                  if (uVar7 != 0) {
                    pcVar20 = "gap";
                    uVar14 = 0xd01;
                    goto LAB_00196c7b;
                  }
                }
                if ((pRVar18->meshlink != (void *)0x0) &&
                   (uVar7 = ref_meshlink_face_curvature
                                      (local_148,RVar22,&local_180,local_c8,&local_188,local_e8),
                   uVar7 != 0)) {
                  pcVar20 = "curve";
                  uVar14 = 0xd04;
                  goto LAB_00196c7b;
                }
                __stream = local_158;
                dVar30 = local_180;
                if (local_180 <= -local_180) {
                  dVar30 = -local_180;
                }
                dVar5 = local_188;
                if (local_188 <= -local_188) {
                  dVar5 = -local_188;
                }
                dVar6 = dVar30;
                if (dVar30 <= dVar5) {
                  dVar6 = dVar5;
                }
                if (dVar5 <= dVar30) {
                  dVar30 = dVar5;
                }
                fprintf(local_158," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n",local_138,
                        local_130,local_128,local_178,*pRVar9,pRVar9[1],dVar6,dVar30);
                if ((long)local_160->n <= (long)local_110) break;
                piVar11 = (int *)((long)local_160->key + lVar15);
                pRVar9 = pRVar9 + 2;
                pRVar12 = (REF_INT *)(lVar15 + (long)local_160->value);
                local_110 = (REF_DBL *)((long)local_110 + 1);
                lVar15 = lVar15 + 4;
              }
            }
            pRVar23 = local_108;
            if (0 < local_168->n) {
              piVar11 = local_168->key;
              pRVar12 = local_168->value;
              lVar15 = local_100 * 2;
              local_110 = local_118 + local_100 * 2;
              lVar24 = 4;
              local_148 = (REF_GRID)0x1;
              lVar19 = 0;
              while( true ) {
                pRVar18 = local_150;
                iVar21 = *piVar11;
                lVar16 = (long)iVar21;
                local_180 = 0.0;
                local_188 = 0.0;
                local_178 = 0.0;
                pRVar9 = pRVar23->real;
                local_138 = pRVar9[lVar16 * 0xf];
                local_130 = pRVar9[lVar16 * 0xf + 1];
                local_128 = pRVar9[lVar16 * 0xf + 2];
                if (local_150->model == (void *)0x0) {
                  auVar31 = (undefined1  [16])0x0;
                  lVar16 = lVar15;
                }
                else {
                  uVar7 = ref_egads_face_curvature
                                    (local_150,*pRVar12,&local_180,local_c8,&local_188,local_e8);
                  if (1 < uVar7) {
                    pcVar20 = "curve";
                    uVar14 = 0xd15;
                    goto LAB_00196c7b;
                  }
                  uVar7 = ref_egads_eval_at(pRVar18,2,local_198,local_110,&local_138,(REF_DBL *)0x0)
                  ;
                  if (uVar7 != 0) {
                    pcVar20 = "eval at";
                    uVar14 = 0xd18;
                    goto LAB_00196c7b;
                  }
                  uVar7 = ref_egads_gap(pRVar18,iVar21,&local_178);
                  if (uVar7 != 0) {
                    pcVar20 = "gap";
                    uVar14 = 0xd19;
                    goto LAB_00196c7b;
                  }
                  auVar31._8_8_ = local_188;
                  auVar31._0_8_ = local_180;
                  lVar16 = (local_100 + lVar19) * 2;
                  pRVar23 = local_108;
                }
                __stream = local_158;
                auVar28._0_8_ = auVar31._0_8_ ^ 0x8000000000000000;
                auVar28._8_4_ = auVar31._8_4_;
                auVar28._12_4_ = auVar31._12_4_ ^ 0x80000000;
                auVar31 = maxpd(auVar31,auVar28);
                dVar30 = auVar31._0_8_;
                if (auVar31._0_8_ <= auVar31._8_8_) {
                  dVar30 = auVar31._8_8_;
                }
                fprintf(local_158," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_138,
                        local_130,local_128,local_178,local_118[lVar16],local_118[lVar16 + 1],dVar30
                        ,dVar30);
                if ((long)local_168->n <= (long)local_148) break;
                piVar11 = (int *)((long)local_168->key + lVar24);
                lVar15 = lVar15 + 2;
                local_110 = local_110 + 2;
                pRVar12 = (REF_INT *)(lVar24 + (long)local_168->value);
                lVar24 = lVar24 + 4;
                local_148 = (REF_GRID)((long)&local_148->mpi + 1);
                lVar19 = lVar19 + 1;
              }
            }
            if (0 < local_170->n) {
              piVar11 = local_170->value;
              local_148 = (REF_GRID)(long)local_140;
              lVar15 = 0;
              while( true ) {
                pRVar18 = local_150;
                iVar21 = *piVar11;
                lVar19 = (long)iVar21;
                local_180 = 0.0;
                local_188 = 0.0;
                local_178 = 0.0;
                pRVar9 = pRVar23->real;
                local_138 = pRVar9[lVar19 * 0xf];
                local_130 = pRVar9[lVar19 * 0xf + 1];
                local_128 = pRVar9[lVar19 * 0xf + 2];
                if (local_150->model == (void *)0x0) {
                  lVar19 = (long)local_148->cell + lVar15 + -0x10;
                  auVar32 = (undefined1  [16])0x0;
                }
                else {
                  if (((-1 < iVar21) && (pRVar2 = local_150->ref_adj, iVar21 < pRVar2->nnode)) &&
                     (iVar26 = pRVar2->first[lVar19], iVar26 != -1)) {
                    pRVar13 = pRVar2->item;
                    do {
                      iVar33 = pRVar13[iVar26].ref;
                      if (((pRVar18->descr[(long)iVar33 * 6] == 2) &&
                          (pRVar18->descr[(int)(iVar33 * 6 | 1)] == local_198)) &&
                         (uVar7 = ref_egads_face_curvature
                                            (pRVar18,iVar33,&local_180,local_c8,&local_188,local_e8)
                         , 1 < uVar7)) {
                        pcVar20 = "curve";
                        uVar14 = 0xd2d;
                        goto LAB_00196c7b;
                      }
                      pRVar13 = pRVar18->ref_adj->item;
                      iVar26 = pRVar13[iVar26].next;
                    } while (iVar26 != -1);
                  }
                  lVar19 = (long)local_148->cell + lVar15 + -0x10;
                  uVar7 = ref_egads_eval_at(pRVar18,2,local_198,local_118 + lVar19 * 2,&local_138,
                                            (REF_DBL *)0x0);
                  if (uVar7 != 0) {
                    pcVar20 = "eval at";
                    uVar14 = 0xd32;
                    goto LAB_00196c7b;
                  }
                  uVar7 = ref_egads_gap(pRVar18,iVar21,&local_178);
                  if (uVar7 != 0) {
                    pcVar20 = "gap";
                    uVar14 = 0xd33;
                    goto LAB_00196c7b;
                  }
                  auVar32._8_8_ = local_188;
                  auVar32._0_8_ = local_180;
                  pRVar23 = local_108;
                  __stream = local_158;
                }
                auVar29._0_8_ = auVar32._0_8_ ^ 0x8000000000000000;
                auVar29._8_4_ = auVar32._8_4_;
                auVar29._12_4_ = auVar32._12_4_ ^ 0x80000000;
                auVar31 = maxpd(auVar32,auVar29);
                dVar30 = auVar31._0_8_;
                if (auVar31._0_8_ <= auVar31._8_8_) {
                  dVar30 = auVar31._8_8_;
                }
                fprintf(__stream," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",local_138,
                        local_130,local_128,local_178,local_118[lVar19 * 2],
                        local_118[lVar19 * 2 + 1],dVar30,dVar30);
                lVar15 = lVar15 + 1;
                if (local_170->n <= lVar15) break;
                piVar11 = local_170->value + lVar15;
              }
            }
            ref_dict_00 = local_170;
            uVar7 = local_198;
            local_194 = -1;
            free(local_118);
            pRVar18 = local_150;
            if (0 < local_190->max) {
              iVar21 = 0;
              pRVar17 = local_190;
              do {
                RVar8 = ref_cell_nodes(pRVar17,iVar21,local_a8);
                if ((RVar8 == 0) && (local_a8[3] == uVar7)) {
                  if (0 < pRVar17->node_per) {
                    lVar15 = 0;
                    do {
                      RVar22 = local_a8[lVar15];
                      uVar7 = ref_geom_find(pRVar18,RVar22,2,local_198,&local_194);
                      if (uVar7 != 0) {
                        pcVar20 = "find";
                        uVar14 = 0xd41;
                        goto LAB_00196c7b;
                      }
                      uVar7 = ref_geom_cell_tuv(pRVar18,RVar22,local_a8,2,&local_f8,
                                                (REF_INT *)&local_13c);
                      pRVar17 = local_190;
                      if (uVar7 != 0) {
                        pcVar20 = "cell tuv";
                        uVar14 = 0xd44;
                        goto LAB_00196c7b;
                      }
                      if (pRVar18->descr[(long)local_194 * 6 + 4] == 0) {
                        if (local_13c < 2) {
                          uVar7 = ref_dict_location(local_160,local_a8[lVar15],&local_19c);
                          if (uVar7 != 0) {
                            pcVar20 = "localize";
                            uVar14 = 0xd47;
                            goto LAB_00196c7b;
                          }
                        }
                        else {
                          uVar7 = ref_dict_location(local_168,local_a8[lVar15],&local_19c);
                          if (uVar7 != 0) {
                            pcVar20 = "localize";
                            uVar14 = 0xd4a;
                            goto LAB_00196c7b;
                          }
                          local_19c = local_19c + (int)local_100;
                        }
                      }
                      else {
                        uVar7 = ref_dict_location(local_170,iVar21,&local_19c);
                        if (uVar7 != 0) {
                          pcVar20 = "localize";
                          uVar14 = 0xd4e;
                          goto LAB_00196c7b;
                        }
                        local_19c = local_19c + local_140;
                      }
                      fprintf(local_158," %d",(ulong)(local_19c + 1));
                      lVar15 = lVar15 + 1;
                    } while (lVar15 < pRVar17->node_per);
                  }
                  fputc(10,local_158);
                  uVar7 = local_198;
                }
                iVar21 = iVar21 + 1;
                ref_dict_00 = local_170;
              } while (iVar21 < pRVar17->max);
            }
            uVar7 = ref_dict_free(ref_dict_00);
            if (uVar7 == 0) {
              uVar7 = ref_dict_free(local_168);
              if (uVar7 == 0) {
                uVar7 = ref_dict_free(local_160);
                if (uVar7 == 0) {
                  return 0;
                }
                pcVar20 = "free dict";
                uVar14 = 0xd59;
              }
              else {
                pcVar20 = "free jump";
                uVar14 = 0xd58;
              }
            }
            else {
              pcVar20 = "free degen";
              uVar14 = 0xd57;
            }
            goto LAB_00196c7b;
          }
        }
        uVar7 = ref_dict_free(local_170);
        if (uVar7 == 0) {
          uVar7 = ref_dict_free(local_168);
          if (uVar7 == 0) {
            uVar7 = ref_dict_free(local_160);
            if (uVar7 == 0) {
              return 0;
            }
            pcVar20 = "free dict";
            uVar14 = 0xcd0;
          }
          else {
            pcVar20 = "free jump";
            uVar14 = 0xccf;
          }
        }
        else {
          pcVar20 = "free degen";
          uVar14 = 0xcce;
        }
      }
      else {
        pcVar20 = "create dict";
        uVar14 = 0xcab;
      }
    }
    else {
      pcVar20 = "create dict";
      uVar14 = 0xcaa;
    }
  }
  else {
    pcVar20 = "create dict";
    uVar14 = 0xca9;
  }
LAB_00196c7b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar14,
         "ref_geom_face_tec_zone",(ulong)uVar7,pcVar20);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict, ref_dict_jump, ref_dict_degen;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item2, item, local, node;
  REF_INT nnode, nnode_sens0, nnode_degen, ntri;
  REF_INT sens;
  REF_DBL *uv, param[2];
  REF_DBL kr, r[3], ks, s[3], xyz[3], kmin, kmax, gap;

  RSS(ref_dict_create(&ref_dict), "create dict");
  RSS(ref_dict_create(&ref_dict_jump), "create dict");
  RSS(ref_dict_create(&ref_dict_degen), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (id == ref_geom_id(ref_geom, geom)) {
      if (0 == ref_geom_degen(ref_geom, geom)) {
        RSS(ref_dict_store(ref_dict, node, geom), "mark nodes");
        if (0 != ref_geom_jump(ref_geom, geom)) {
          RSS(ref_dict_store(ref_dict_jump, node, geom), "mark jump");
        }
      } else {
        each_ref_cell_having_node(ref_cell, node, item, cell) {
          RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
          if (id == nodes[3]) {
            RSS(ref_dict_store(ref_dict_degen, cell, node), "mark degen");
          }
        }
      }
    }
  }

  nnode_sens0 = ref_dict_n(ref_dict);
  nnode_degen = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump);
  nnode = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump) +
          ref_dict_n(ref_dict_degen);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict_degen), "free degen");
    RSS(ref_dict_free(ref_dict_jump), "free jump");
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  ref_malloc_init(uv, 2 * nnode, REF_DBL, -1.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        uv[0 + 2 * local] = param[0];
        uv[1 + 2 * local] = param[1];
      }
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, &(uv[2 * item]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s), "curve");
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MIN(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], kmax,
            kmin);
  }
  each_ref_dict_key_value(ref_dict_jump, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_sens0 + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_sens0 + item)],
            uv[1 + 2 * (nnode_sens0 + item)], kmax, kmin);
  }
  each_ref_dict_key_value(ref_dict_degen, item, cell, node) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      each_ref_geom_having_node(ref_geom, node, item2, geom) {
        if (ref_geom_type(ref_geom, geom) == REF_GEOM_FACE &&
            ref_geom_id(ref_geom, geom) == id) {
          RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
              REF_FAILURE, "curve");
        }
      }
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_degen + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_degen + item)],
            uv[1 + 2 * (nnode_degen + item)], kmax, kmin);
  }
  ref_free(uv);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict_degen), "free degen");
  RSS(ref_dict_free(ref_dict_jump), "free jump");
  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}